

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::ReadChannelInfo
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  value_type vVar1;
  bool bVar2;
  const_reference pvVar3;
  ulong uVar4;
  ulong uVar5;
  const_reference pvVar6;
  ChannelInfo info;
  value_type local_88;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
  do {
    vVar1 = *pvVar3;
    if (vVar1 == '\0') break;
    local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
    local_88.name._M_string_length = 0;
    local_88.name.field_2._M_local_buf[0] = '\0';
    uVar4 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pvVar3;
    if (-1 < (long)uVar4) {
      pvVar6 = pvVar3;
      for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        if (*pvVar6 == '\0') {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pvVar3,pvVar6);
          std::__cxx11::string::operator=((string *)&local_88,(string *)local_50);
          std::__cxx11::string::~string((string *)local_50);
          pvVar3 = pvVar6 + 0x11;
          if (pvVar3 < (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish) {
            local_88.pixel_type = *(int *)(pvVar6 + 1);
            local_88.p_linear = pvVar6[5];
            local_88.x_sampling = *(int *)(pvVar6 + 9);
            local_88.y_sampling = *(int *)(pvVar6 + 0xd);
            bVar2 = true;
            std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                      (channels,&local_88);
          }
          else {
            pvVar3 = pvVar6 + 1;
            bVar2 = false;
          }
          goto LAB_001af0df;
        }
        pvVar6 = pvVar6 + 1;
      }
      pvVar3 = (const_reference)0x0;
    }
    bVar2 = false;
LAB_001af0df:
    std::__cxx11::string::~string((string *)&local_88);
  } while (bVar2);
  return vVar1 == '\0';
}

Assistant:

static bool ReadChannelInfo(std::vector<ChannelInfo> &channels,
                            const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;

    tinyexr_int64 data_len = static_cast<tinyexr_int64>(data.size()) -
                             (p - reinterpret_cast<const char *>(data.data()));
    if (data_len < 0) {
      return false;
    }

    p = ReadString(&info.name, p, size_t(data_len));
    if ((p == NULL) && (info.name.empty())) {
      // Buffer overrun. Issue #51.
      return false;
    }

    const unsigned char *data_end =
        reinterpret_cast<const unsigned char *>(p) + 16;
    if (data_end >= (data.data() + data.size())) {
      return false;
    }

    memcpy(&info.pixel_type, p, sizeof(int));
    p += 4;
    info.p_linear = static_cast<unsigned char>(p[0]);  // uchar
    p += 1 + 3;                                        // reserved: uchar[3]
    memcpy(&info.x_sampling, p, sizeof(int));          // int
    p += 4;
    memcpy(&info.y_sampling, p, sizeof(int));  // int
    p += 4;

    tinyexr::swap4(&info.pixel_type);
    tinyexr::swap4(&info.x_sampling);
    tinyexr::swap4(&info.y_sampling);

    channels.push_back(info);
  }

  return true;
}